

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synthesis.cpp
# Opt level: O0

void anon_unknown.dwarf_2cdd::RemoveDCComponent
               (double *periodic_response,int fft_size,double *dc_remover,
               double *new_periodic_response)

{
  int local_3c;
  int local_38;
  int i_2;
  int i_1;
  int i;
  double dc_component;
  double *new_periodic_response_local;
  double *dc_remover_local;
  int fft_size_local;
  double *periodic_response_local;
  
  _i_1 = 0.0;
  for (i_2 = fft_size / 2; i_2 < fft_size; i_2 = i_2 + 1) {
    _i_1 = periodic_response[i_2] + _i_1;
  }
  for (local_38 = 0; local_38 < fft_size / 2; local_38 = local_38 + 1) {
    new_periodic_response[local_38] = -_i_1 * dc_remover[local_38];
  }
  for (local_3c = fft_size / 2; local_3c < fft_size; local_3c = local_3c + 1) {
    new_periodic_response[local_3c] = -_i_1 * dc_remover[local_3c] + new_periodic_response[local_3c]
    ;
  }
  return;
}

Assistant:

static void RemoveDCComponent(const double *periodic_response, int fft_size,
    const double *dc_remover, double *new_periodic_response) {
  double dc_component = 0.0;
  for (int i = fft_size / 2; i < fft_size; ++i)
    dc_component += periodic_response[i];
  for (int i = 0; i < fft_size / 2; ++i)
    new_periodic_response[i] = -dc_component * dc_remover[i];
  for (int i = fft_size / 2; i < fft_size; ++i)
    new_periodic_response[i] -= dc_component * dc_remover[i];
}